

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O2

void __thiscall Assimp::FBX::AnimationCurve::~AnimationCurve(AnimationCurve *this)

{
  ~AnimationCurve(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

AnimationCurve::~AnimationCurve()
{
    // empty
}